

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O1

void __thiscall
duckdb::WindowCursor::WindowCursor
          (WindowCursor *this,WindowCollection *paged,vector<unsigned_long,_true> *column_ids)

{
  idx_t iVar1;
  pointer pCVar2;
  vector<unsigned_long,_true> local_48;
  
  this->paged = paged;
  (this->state).current_chunk_state.handles._M_h._M_buckets =
       &(this->state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->state).current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->state).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->state).current_chunk_state.properties = INVALID;
  (this->state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataChunk::DataChunk(&this->chunk);
  if ((column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->state).segment_index = 0;
    (this->state).chunk_index = 0;
    (this->state).current_row_index = 0;
    iVar1 = paged->count;
    (this->state).next_row_index = iVar1;
    (this->state).properties = ALLOW_ZERO_COPY;
    (this->chunk).capacity = iVar1;
    (this->chunk).count = iVar1;
  }
  else if ((this->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&paged->inputs);
    local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ColumnDataCollection::InitializeScan(pCVar2,&this->state,&local_48,ALLOW_ZERO_COPY);
    if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&paged->inputs);
    ColumnDataCollection::InitializeScanChunk(pCVar2,&this->state,&this->chunk);
  }
  return;
}

Assistant:

WindowCursor::WindowCursor(const WindowCollection &paged, vector<column_t> column_ids) : paged(paged) {
	D_ASSERT(paged.collections.empty());
	D_ASSERT(paged.ranges.empty());
	if (column_ids.empty()) {
		//	For things like COUNT(*) set the state up to contain the whole range
		state.segment_index = 0;
		state.chunk_index = 0;
		state.current_row_index = 0;
		state.next_row_index = paged.size();
		state.properties = ColumnDataScanProperties::ALLOW_ZERO_COPY;
		chunk.SetCapacity(state.next_row_index);
		chunk.SetCardinality(state.next_row_index);
		return;
	} else if (chunk.data.empty()) {
		auto &inputs = paged.inputs;
		D_ASSERT(inputs.get());
		inputs->InitializeScan(state, std::move(column_ids));
		inputs->InitializeScanChunk(state, chunk);
	}
}